

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

void chrono::fea::rotutils::RotCo<chrono::ChVector<double>,double>
               (int cid,ChVector<double> *phi,ChVector<double> *p,double *cf)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double phip [10];
  
  dVar4 = ChVector<double>::Dot(phi,phi);
  dVar5 = ChVector<double>::Length(p);
  if (*(double *)(&DAT_00f145a8 + (long)cid * 8) <= dVar5) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar4;
    if (dVar4 < 0.0) {
      dVar5 = sqrt(dVar4);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar5 = auVar9._0_8_;
    }
    dVar6 = sin(dVar5);
    *cf = dVar6 / dVar5;
    if (cid != 1) {
      dVar5 = cos(dVar5);
      auVar7._0_8_ = (1.0 - dVar5) / dVar4;
      auVar7._8_8_ = 0;
      cf[1] = auVar7._0_8_;
      if (cid != 2) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *cf;
        auVar10._0_8_ = (1.0 - *cf) / dVar4;
        auVar10._8_8_ = 0;
        cf[2] = auVar10._0_8_;
        if (cid != 3) {
          auVar9 = vfmadd231sd_fma(auVar11,auVar7,ZEXT816(0xc000000000000000));
          auVar12._0_8_ = auVar9._0_8_ / dVar4;
          auVar12._8_8_ = auVar9._8_8_;
          cf[3] = auVar12._0_8_;
          if (cid != 4) {
            auVar9 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar10,auVar7);
            cf[4] = auVar9._0_8_ / dVar4;
            if (cid != 5) {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = auVar10._0_8_ - auVar7._0_8_;
              auVar9 = vfmadd231sd_fma(auVar8,auVar12,ZEXT816(0xc010000000000000));
              cf[5] = auVar9._0_8_ / dVar4;
            }
          }
        }
      }
    }
  }
  else {
    phip[0] = 1.0;
    dVar5 = 1.0;
    for (lVar1 = 1; lVar1 != 10; lVar1 = lVar1 + 1) {
      dVar5 = dVar4 * dVar5;
      phip[lVar1] = dVar5;
    }
    puVar2 = &SerCoeff;
    for (uVar3 = 0; uVar3 != (uint)(~(cid >> 0x1f) & cid); uVar3 = uVar3 + 1) {
      cf[uVar3] = 0.0;
      dVar4 = 0.0;
      for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
        dVar4 = dVar4 + phip[lVar1] / (double)puVar2[lVar1];
      }
      cf[uVar3] = dVar4;
      puVar2 = puVar2 + 9;
    }
  }
  return;
}

Assistant:

void RotCo(const int cid, const T1& phi, const ChVector<>& p, T2* const cf) {
    T2 phip[10];
    T2 phi2(phi ^ phi);
    double mp(p.Length());  // (sqrt(p.Dot()));
    int k, j;

    if (mp < SerThrsh[cid - 1]) {
        phip[0] = 1.;
        for (j = 1; j <= 9; j++) {
            phip[j] = phip[j - 1] * phi2;
        }
        for (k = 0; k < cid; k++) {
            cf[k] = 0.;
            for (j = 0; j < SerTrunc[k]; j++) {
                cf[k] += phip[j] / SerCoeff[k][j];
            }
        }

        return;
    }

    const T2 ID(1.);
    T2 pd(sqrt(phi2));
    cf[0] = sin(pd) / pd;  // a = sin(phi)/phi
    if (cid == 1)
        return;
    cf[1] = (ID - cos(pd)) / phi2;  // b = (1.-cos(phi))/phi2
    if (cid == 2)
        return;
    cf[2] = (ID - cf[0]) / phi2;  // c = (1.-a)/phi2
    if (cid == 3)
        return;
    cf[3] = (cf[0] - (cf[1] * 2.)) / phi2;  // d = (a-2*b)/phi2
    if (cid == 4)
        return;
    cf[4] = (cf[1] - (cf[2] * 3.)) / phi2;  // e = (b-3*c)/phi2
    if (cid == 5)
        return;
    cf[5] = (cf[2] - cf[1] - (cf[3] * 4.)) / phi2;  // f = (c-b-4*d)/phi2
    // if (cid == 6) return; inutile
    return;
}